

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 ProcessScript(jx9 *pEngine,jx9_vm **ppVm,SyString *pScript,sxi32 iFlags,char *zFilePath)

{
  GenBlock *pBlock;
  char cVar1;
  void *pvVar2;
  ProcConstant xExpand;
  jx9_vm *pjVar3;
  ProcConsumer p_Var4;
  char *pcVar5;
  sxi32 sVar6;
  int iVar7;
  sxu32 sVar8;
  jx9_vm *pVm;
  jx9_value *pjVar9;
  char *pcVar10;
  ushort **ppuVar11;
  undefined4 in_register_0000000c;
  ProcCmp zPath;
  ProcCmp xCmp;
  char *pcVar12;
  sxi32 iFlags_00;
  ProcHash xHash;
  ProcHash xHash_00;
  ProcHash xHash_01;
  ProcHash xHash_02;
  void *pUserData;
  ProcHash xHash_03;
  ProcHash xHash_04;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  SyString local_40;
  
  zPath = (ProcCmp)CONCAT44(in_register_0000000c,iFlags);
  xCmp = zPath;
  pVm = (jx9_vm *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x6e8);
  if (pVm == (jx9_vm *)0x0) {
    sVar6 = -1;
LAB_001204cd:
    if (ppVm == (jx9_vm **)0x0) {
      return sVar6;
    }
  }
  else {
    SyZero(pVm,0x6e8);
    pVm->pEngine = pEngine;
    SyMemBackendInitFromParent((SyMemBackend *)pVm,&pEngine->sAllocator);
    (pVm->aByteCode).nUsed = 0;
    (pVm->aByteCode).nSize = 0;
    (pVm->aByteCode).eSize = 0x18;
    (pVm->aByteCode).nCursor = 0;
    (pVm->aByteCode).pAllocator = (SyMemBackend *)pVm;
    (pVm->aByteCode).pBase = (void *)0x0;
    (pVm->aByteCode).pUserData = (void *)0x0;
    SySetAlloc(&pVm->aByteCode,0xff);
    pVm->pByteContainer = &pVm->aByteCode;
    (pVm->aMemObj).nUsed = 0;
    (pVm->aMemObj).nSize = 0;
    (pVm->aMemObj).eSize = 0x40;
    (pVm->aMemObj).nCursor = 0;
    (pVm->aMemObj).pAllocator = (SyMemBackend *)pVm;
    (pVm->aMemObj).pBase = (void *)0x0;
    (pVm->aMemObj).pUserData = (void *)0x0;
    SySetAlloc(&pVm->aMemObj,0xff);
    (pVm->sConsumer).pBlob = (void *)0x0;
    (pVm->sConsumer).nByte = 0;
    (pVm->sConsumer).mByte = 0;
    (pVm->sConsumer).pAllocator = (SyMemBackend *)pVm;
    (pVm->sConsumer).nFlags = 0;
    (pVm->sWorker).pBlob = (void *)0x0;
    (pVm->sWorker).nByte = 0;
    (pVm->sWorker).mByte = 0;
    (pVm->sWorker).pAllocator = (SyMemBackend *)pVm;
    (pVm->sWorker).nFlags = 0;
    (pVm->sArgv).pBlob = (void *)0x0;
    (pVm->sArgv).nByte = 0;
    (pVm->sArgv).mByte = 0;
    (pVm->sArgv).pAllocator = (SyMemBackend *)pVm;
    (pVm->sArgv).nFlags = 0;
    (pVm->aLitObj).nUsed = 0;
    (pVm->aLitObj).nSize = 0;
    (pVm->aLitObj).eSize = 0x40;
    (pVm->aLitObj).nCursor = 0;
    (pVm->aLitObj).pAllocator = (SyMemBackend *)pVm;
    (pVm->aLitObj).pBase = (void *)0x0;
    (pVm->aLitObj).pUserData = (void *)0x0;
    SySetAlloc(&pVm->aLitObj,0xff);
    SyHashInit(&pVm->hHostFunction,(SyMemBackend *)pVm,xHash,xCmp);
    SyHashInit(&pVm->hFunction,(SyMemBackend *)pVm,xHash_00,xCmp);
    SyHashInit(&pVm->hConstant,(SyMemBackend *)pVm,xHash_01,xCmp);
    SyHashInit(&pVm->hSuper,(SyMemBackend *)pVm,xHash_02,xCmp);
    (pVm->aFreeObj).nUsed = 0;
    (pVm->aFreeObj).nSize = 0;
    (pVm->aFreeObj).eSize = 0x10;
    (pVm->aFreeObj).nCursor = 0;
    (pVm->aFreeObj).pAllocator = (SyMemBackend *)pVm;
    (pVm->aFreeObj).pBase = (void *)0x0;
    (pVm->aFreeObj).pUserData = (void *)0x0;
    (pVm->aFiles).nUsed = 0;
    (pVm->aFiles).nSize = 0;
    (pVm->aFiles).eSize = 0x10;
    (pVm->aFiles).nCursor = 0;
    (pVm->aFiles).pAllocator = (SyMemBackend *)pVm;
    (pVm->aFiles).pBase = (void *)0x0;
    (pVm->aFiles).pUserData = (void *)0x0;
    (pVm->aPaths).nUsed = 0;
    (pVm->aPaths).nSize = 0;
    (pVm->aPaths).eSize = 0x10;
    (pVm->aPaths).nCursor = 0;
    (pVm->aPaths).pAllocator = (SyMemBackend *)pVm;
    (pVm->aPaths).pBase = (void *)0x0;
    (pVm->aPaths).pUserData = (void *)0x0;
    (pVm->aIncluded).nUsed = 0;
    (pVm->aIncluded).nSize = 0;
    (pVm->aIncluded).eSize = 0x10;
    (pVm->aIncluded).nCursor = 0;
    (pVm->aIncluded).pAllocator = (SyMemBackend *)pVm;
    (pVm->aIncluded).pBase = (void *)0x0;
    (pVm->aIncluded).pUserData = (void *)0x0;
    (pVm->aIOstream).nUsed = 0;
    (pVm->aIOstream).nSize = 0;
    (pVm->aIOstream).eSize = 8;
    (pVm->aIOstream).nCursor = 0;
    (pVm->aIOstream).pAllocator = (SyMemBackend *)pVm;
    (pVm->aIOstream).pBase = (void *)0x0;
    (pVm->aIOstream).pUserData = (void *)0x0;
    pjVar9 = &pVm->sAssertCallback;
    jx9MemObjInit(pVm,pjVar9);
    pVm->nMaxDepth = 0x20;
    pVm->iAssertFlags = 2;
    SyRandomnessInit(&pVm->sPrng,(ProcRandomSeed)pjVar9,pUserData);
    pjVar9 = jx9VmReserveConstObj(pVm,(sxu32 *)0x0);
    if (pjVar9 == (jx9_value *)0x0) {
LAB_001204b4:
      SyMemBackendRelease((SyMemBackend *)pVm);
      SyMemBackendPoolFree(&pEngine->sAllocator,pVm);
      sVar6 = -0x47;
      goto LAB_001204cd;
    }
    jx9MemObjInit(pVm,pjVar9);
    pjVar9 = jx9VmReserveConstObj(pVm,(sxu32 *)0x0);
    if (pjVar9 == (jx9_value *)0x0) goto LAB_001204b4;
    jx9MemObjInitFromBool(pVm,pjVar9,1);
    pjVar9 = jx9VmReserveConstObj(pVm,(sxu32 *)0x0);
    if (pjVar9 == (jx9_value *)0x0) goto LAB_001204b4;
    jx9MemObjInitFromBool(pVm,pjVar9,0);
    sVar6 = VmEnterFrame(pVm,(void *)0x0,(VmFrame **)0x0);
    if (sVar6 != 0) goto LAB_001204b4;
    p_Var4 = (pEngine->xConf).xErr;
    pvVar2 = (pEngine->xConf).pErrData;
    SyZero(&pVm->sCodeGen,0x170);
    (pVm->sCodeGen).pVm = pVm;
    (pVm->sCodeGen).xErr = p_Var4;
    (pVm->sCodeGen).pErrData = pvVar2;
    SyHashInit(&(pVm->sCodeGen).hLiteral,(SyMemBackend *)pVm,xHash_03,xCmp);
    SyHashInit(&(pVm->sCodeGen).hVar,(SyMemBackend *)pVm,xHash_04,xCmp);
    pBlock = &(pVm->sCodeGen).sGlobal;
    iVar7 = 0;
    GenStateInitBlock(&pVm->sCodeGen,pBlock,0x10,pVm->pByteContainer->nUsed,(void *)0x0);
    (pVm->sCodeGen).pCurrent = pBlock;
    pVm->nMagic = 0xea12cd72;
    local_40.zString =
         "function scandir(string $directory, int $sort_order = SCANDIR_SORT_ASCENDING){  if( func_num_args() < 1 ){ return FALSE; }  $aDir = [];  $pHandle = opendir($directory);  if( $pHandle == FALSE ){ return FALSE; }  while(FALSE !== ($pEntry = readdir($pHandle)) ){      $aDir[] = $pEntry;   }  closedir($pHandle);  if( $sort_order == SCANDIR_SORT_DESCENDING ){      rsort($aDir);  }else if( $sort_order == SCANDIR_SORT_ASCENDING ){      sort($aDir);  }  return $aDir;}function glob(string $pattern, int $iFlags = 0){/* Open the target directory */$zDir = dirname($pattern);if(!is_string($zDir) ){ $zDir = \'./\'; }$pHandle = opendir($zDir);if( $pHandle == FALSE ){   /* IO error while opening the current directory, return FALSE */\treturn FALSE;}$pattern = basename($pattern);$pArray = []; /* Empty array *//* Loop throw available entries */while( FALSE !== ($pEntry = readdir($pHandle)) ){ /* Use the built-in strglob function which is a Symisc eXtension for wildcard comparison*/\t$rc = strglob($pattern, $pEntry);\tif( $rc ){\t   if( is_dir($pEntry) ){\t      if( $iFlags & GLOB_MARK ){\t\t     /* Adds a slash to each directory returned */\t\t\t $pEntry .= DIRECTORY_SEPARATOR;\t\t  }\t   }else if( $iFlags & GLOB_ONLYDIR ){\t     /* Not a directory, ignore */\t\t continue;\t   }\t   /* Add the entry */\t   $pArray[] = $pEntry;\t} }/* Close the handle */closedir($pHandle);if( ($iFlags & GLOB_NOSORT) == 0 ){  /* Sort the array */  sort($pArray);}if( ($iFlags & GLOB_NOCHECK) && sizeof($pArray) < 1 ){  /* Return the search pattern if no files matching were found */  $pArray[] = $pattern;}/* Return the created array */return $pArray;}/* Creates a temporary file */function tmpfile(){  /* Extract the temp directory */  $zTempDir = sys_get_temp_dir();  if( strlen($zTempDir) < 1 ){    /* Use the current dir */    $zTempDir = \'.\';  }  /* Create the file */  $pHandle = fopen($zTempDir.DIRECTORY_SEPARATOR.\'JX9\'.rand_str(12), \'w+\');  return $pHandle;}/* Creates a temporary filename */function tempnam(string $zDir = sys_get_temp_dir() /* Symisc eXtension */, string ..." /* TRUNCATED STRING LITERAL */
    ;
    local_40.nByte = 0xc46;
    VmEvalChunk(pVm,(jx9_context *)0x0,&local_40,0,iVar7);
    jx9ResetCodeGenerator(pVm,(pEngine->xConf).xErr,(pEngine->xConf).pErrData);
    if (zPath != (ProcCmp)0x0) {
      jx9VmPushFilePath(pVm,(char *)zPath,-1,'\x01',(sxi32 *)0x0);
    }
    SyBlobReset(&(pEngine->xConf).sErrConsumer);
    jx9CompileScript(pVm,pScript,iFlags_00);
    if ((pVm->sCodeGen).nErr != 0) {
      SyMemBackendRelease((SyMemBackend *)pVm);
      SyMemBackendPoolFree(&pEngine->sAllocator,pVm);
      sVar6 = -0x46;
      goto LAB_001204cd;
    }
    if (pVm->nMagic == 0xea12cd72) {
      pVm->nMagic = 0xba851227;
      jx9ResetCodeGenerator(pVm,(ProcConsumer)0x0,(void *)0x0);
      sVar6 = jx9VmEmitInstr(pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
      if (sVar6 == 0) {
        jx9MemObjInit(pVm,&pVm->sExec);
        pjVar9 = VmNewOperandStack(pVm,pVm->pByteContainer->nUsed);
        pVm->aOps = pjVar9;
        if (pjVar9 != (jx9_value *)0x0) {
          (pVm->sVmConsumer).xConsumer = jx9VmBlobConsumer;
          (pVm->sVmConsumer).pUserData = &pVm->sConsumer;
          lVar13 = 8;
          do {
            if (lVar13 + 0x10 == 0x1f8) {
              lVar13 = 0;
              goto LAB_001206e2;
            }
            iVar7 = jx9_create_function(pVm,*(char **)((long)&sFCallOp.iAssoc + lVar13),
                                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                                         ((long)&aVmFunc[0].zName + lVar13),pVm);
            lVar13 = lVar13 + 0x10;
          } while (iVar7 == 0);
        }
      }
    }
LAB_0012063c:
    SyMemBackendRelease((SyMemBackend *)pVm);
    SyMemBackendPoolFree(&pEngine->sAllocator,pVm);
    sVar6 = -0x47;
  }
  pVm = (jx9_vm *)0x0;
LAB_001204d6:
  *ppVm = pVm;
  return sVar6;
LAB_001206e2:
  if (lVar13 == 0x24) goto LAB_0012072d;
  pjVar9 = jx9_new_array(pVm);
  if ((pjVar9 == (jx9_value *)0x0) ||
     (iVar7 = jx9_vm_config(pVm,6,(long)&jx9HashmapLoadBuiltin_azSuper_rel +
                                  (long)*(int *)((long)&jx9HashmapLoadBuiltin_azSuper_rel + lVar13),
                            pjVar9), iVar7 != 0)) goto LAB_0012063c;
  jx9_release_value(pVm,pjVar9);
  lVar13 = lVar13 + 4;
  goto LAB_001206e2;
LAB_0012072d:
  sVar8 = (pVm->aFiles).nUsed;
  uVar16 = 8;
  pcVar12 = ":Memory:";
  if ((sVar8 != 0) && (pvVar2 = (pVm->aFiles).pBase, pvVar2 != (void *)0x0)) {
    uVar16 = (ulong)((sVar8 - 1) * (pVm->aFiles).eSize);
    pcVar12 = *(char **)((long)pvVar2 + uVar16);
    uVar16 = (ulong)*(uint *)((long)pvVar2 + uVar16 + 8);
  }
  jx9_vm_config(pVm,8,"SCRIPT_FILENAME",pcVar12,uVar16);
  for (lVar13 = 0; lVar13 != 0x7a; lVar13 = lVar13 + 1) {
    if (pVm->nMagic != 0xdead2bad) {
      pcVar12 = aBuiltIn[lVar13].zName;
      xExpand = aBuiltIn[lVar13].xExpand;
      sVar8 = SyStrlen(pcVar12);
      uVar16 = (ulong)sVar8;
      pcVar10 = pcVar12 + uVar16;
      while (((uVar15 = (uint)uVar16, pcVar5 = pcVar10, pcVar14 = pcVar10, uVar15 != 0 &&
              (cVar1 = *pcVar12, pcVar5 = pcVar12, pcVar14 = pcVar12,
              (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
             (ppuVar11 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar11 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
        pcVar12 = pcVar12 + 1;
        uVar16 = uVar16 - 1;
      }
      do {
        local_40.nByte = uVar15;
        local_40.zString = pcVar5;
        uVar17 = uVar16;
        if (uVar17 == 0) goto LAB_00120850;
        cVar1 = pcVar14[uVar17 - 1];
      } while (((ulong)(long)cVar1 < 0xffffffffffffffc0) &&
              (ppuVar11 = __ctype_b_loc(), uVar16 = uVar17 - 1, pcVar5 = local_40.zString,
              uVar15 = local_40.nByte,
              (*(byte *)((long)*ppuVar11 + (long)cVar1 * 2 + 1) & 0x20) != 0));
      local_40.nByte = (uint)uVar17;
      if (xExpand != (ProcConstant)0x0) {
        jx9VmRegisterConstant(pVm,&local_40,xExpand,pVm);
      }
    }
LAB_00120850:
  }
  for (lVar13 = 8; lVar13 != 0x768; lVar13 = lVar13 + 0x10) {
    jx9_create_function(pVm,*(char **)((long)&sjx9Stream.xStat + lVar13),
                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                         ((long)&aBuiltInFunc[0].zName + lVar13),(void *)0x0);
  }
  for (lVar13 = 8; lVar13 != 0x1d8; lVar13 = lVar13 + 0x10) {
    jx9_create_function(pVm,*(char **)((long)zEngMonth + lVar13 + 0x58),
                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                         ((long)&aHashmapFunc[0].zName + lVar13),(void *)0x0);
  }
  for (lVar13 = 8; lVar13 != 0x3b8; lVar13 = lVar13 + 0x10) {
    jx9_create_function(pVm,*(char **)((long)&aHashmapFunc[0x1c].xFunc + lVar13),
                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                         ((long)&jx9RegisterIORoutine_aVfsFunc + lVar13),pVm->pEngine->pVfs);
  }
  for (lVar13 = 8; lVar13 != 0x1f8; lVar13 = lVar13 + 0x10) {
    jx9_create_function(pVm,*(char **)((long)&PTR_jx9Builtin_zip_entry_compressionmethod_00152a08 +
                                      lVar13),
                        *(_func_int_jx9_context_ptr_int_jx9_value_ptr_ptr **)
                         ((long)&jx9RegisterIORoutine_aIOFunc + lVar13),pVm);
  }
  sVar6 = 0;
  jx9_vm_config(pVm,0xb,&sjx9Stream);
  jx9_vm_config(pVm,0xb,&sUnixFileStream);
  jx9_vm_config(pVm,2,"./");
  pjVar3 = pEngine->pVms;
  if (pjVar3 != (jx9_vm *)0x0) {
    pVm->pNext = pjVar3;
    pjVar3->pPrev = pVm;
  }
  pEngine->pVms = pVm;
  pEngine->iVm = pEngine->iVm + 1;
  goto LAB_001204d6;
}

Assistant:

static sxi32 ProcessScript(
	jx9 *pEngine,          /* Running JX9 engine */
	jx9_vm **ppVm,         /* OUT: A pointer to the virtual machine */
	SyString *pScript,     /* Raw JX9 script to compile */
	sxi32 iFlags,          /* Compile-time flags */
	const char *zFilePath  /* File path if script come from a file. NULL otherwise */
	)
{
	jx9_vm *pVm;
	int rc;
	/* Allocate a new virtual machine */
	pVm = (jx9_vm *)SyMemBackendPoolAlloc(&pEngine->sAllocator, sizeof(jx9_vm));
	if( pVm == 0 ){
		/* If the supplied memory subsystem is so sick that we are unable to allocate
		 * a tiny chunk of memory, there is no much we can do here. */
		if( ppVm ){
			*ppVm = 0;
		}
		return JX9_NOMEM;
	}
	if( iFlags < 0 ){
		/* Default compile-time flags */
		iFlags = 0;
	}
	/* Initialize the Virtual Machine */
	rc = jx9VmInit(pVm, &(*pEngine));
	if( rc != JX9_OK ){
		SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
		if( ppVm ){
			*ppVm = 0;
		}
		return JX9_VM_ERR;
	}
	if( zFilePath ){
		/* Push processed file path */
		jx9VmPushFilePath(pVm, zFilePath, -1, TRUE, 0);
	}
	/* Reset the error message consumer */
	SyBlobReset(&pEngine->xConf.sErrConsumer);
	/* Compile the script */
	jx9CompileScript(pVm, &(*pScript), iFlags);
	if( pVm->sCodeGen.nErr > 0 || pVm == 0){
		sxu32 nErr = pVm->sCodeGen.nErr;
		/* Compilation error or null ppVm pointer, release this VM */
		SyMemBackendRelease(&pVm->sAllocator);
		SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
		if( ppVm ){
			*ppVm = 0;
		}
		return nErr > 0 ? JX9_COMPILE_ERR : JX9_OK;
	}
	/* Prepare the virtual machine for bytecode execution */
	rc = jx9VmMakeReady(pVm);
	if( rc != JX9_OK ){
		goto Release;
	}
	/* Install local import path which is the current directory */
	jx9_vm_config(pVm, JX9_VM_CONFIG_IMPORT_PATH, "./");
#if defined(JX9_ENABLE_THREADS)
	if( sJx9MPGlobal.nThreadingLevel > JX9_THREAD_LEVEL_SINGLE ){
		 /* Associate a recursive mutex with this instance */
		 pVm->pMutex = SyMutexNew(sJx9MPGlobal.pMutexMethods, SXMUTEX_TYPE_RECURSIVE);
		 if( pVm->pMutex == 0 ){
			 goto Release;
		 }
	 }
#endif
	/* Script successfully compiled, link to the list of active virtual machines */
	MACRO_LD_PUSH(pEngine->pVms, pVm);
	pEngine->iVm++;
	/* Point to the freshly created VM */
	*ppVm = pVm;
	/* Ready to execute JX9 bytecode */
	return JX9_OK;
Release:
	SyMemBackendRelease(&pVm->sAllocator);
	SyMemBackendPoolFree(&pEngine->sAllocator, pVm);
	*ppVm = 0;
	return JX9_VM_ERR;
}